

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  size_type __bkt;
  __buckets_ptr pp_Var4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  char cVar8;
  key_type *__key;
  size_type __n;
  ulong uVar9;
  _Hash_node_base _Var10;
  _Hash_node_base *p_Var11;
  pointer __ptr_1;
  undefined1 auVar12 [16];
  __buckets_alloc_type __alloc;
  new_allocator<std::__detail::_Hash_node_base_*> local_41;
  __node_ptr local_40;
  size_t local_38;
  
  local_38 = CONCAT44(local_38._4_4_,symbol.type);
  p_Var3 = (_Hash_node_base *)(name->_M_dataplus)._M_p;
  cVar8 = *(char *)&p_Var3->_M_nxt;
  if (cVar8 == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    p_Var11 = p_Var3;
    do {
      p_Var11 = (_Hash_node_base *)((long)&p_Var11->_M_nxt + 1);
      uVar5 = (long)cVar8 + uVar5 * 5;
      cVar8 = *(char *)&p_Var11->_M_nxt;
    } while (cVar8 != '\0');
  }
  p_Var11 = (_Hash_node_base *)((long)parent * 0x1000193 ^ uVar5);
  __bkt = (this->symbols_by_parent_)._M_h._M_bucket_count;
  __key = (key_type *)((ulong)p_Var11 % __bkt);
  local_40 = std::
             _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(this->symbols_by_parent_)._M_h._M_buckets,__bkt,__key,
                            (__hash_code)parent);
  if (local_40 == (__node_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)operator_new(0x30);
    p_Var6->_M_nxt = (_Hash_node_base *)0x0;
    p_Var6[1]._M_nxt = (_Hash_node_base *)parent;
    p_Var6[2]._M_nxt = p_Var3;
    *(undefined4 *)&p_Var6[3]._M_nxt = (undefined4)local_38;
    *(anon_union_8_8_13f84498_for_Symbol_2 *)(p_Var6 + 4) = symbol.field_1;
    local_38 = (this->symbols_by_parent_)._M_h._M_rehash_policy._M_next_resize;
    auVar12 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_parent_)._M_h._M_rehash_policy,
                         (this->symbols_by_parent_)._M_h._M_bucket_count,
                         (this->symbols_by_parent_)._M_h._M_element_count);
    __n = auVar12._8_8_;
    if ((auVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (this->symbols_by_parent_)._M_h._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(this->symbols_by_parent_)._M_h._M_single_bucket;
        (this->symbols_by_parent_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_41,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var10._M_nxt = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var10._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->symbols_by_parent_)._M_h._M_before_begin;
        uVar5 = 0;
        do {
          p_Var3 = (_Var10._M_nxt)->_M_nxt;
          uVar9 = (ulong)_Var10._M_nxt[5]._M_nxt % __n;
          if (__s[uVar9] == (_Hash_node_base *)0x0) {
            (_Var10._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var10._M_nxt;
            __s[uVar9] = p_Var1;
            if ((_Var10._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var7 = __s + uVar5;
              goto LAB_003193f7;
            }
          }
          else {
            (_Var10._M_nxt)->_M_nxt = __s[uVar9]->_M_nxt;
            pp_Var7 = &__s[uVar9]->_M_nxt;
            uVar9 = uVar5;
LAB_003193f7:
            *pp_Var7 = _Var10._M_nxt;
          }
          _Var10._M_nxt = p_Var3;
          uVar5 = uVar9;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (this->symbols_by_parent_)._M_h._M_buckets;
      if (&(this->symbols_by_parent_)._M_h._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4);
      }
      (this->symbols_by_parent_)._M_h._M_bucket_count = __n;
      (this->symbols_by_parent_)._M_h._M_buckets = __s;
      __key = (key_type *)((ulong)p_Var11 % __n);
    }
    p_Var6[5]._M_nxt = p_Var11;
    if (__s[(long)__key] == (_Hash_node_base *)0x0) {
      p_Var3 = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      p_Var6->_M_nxt = p_Var3;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = p_Var6;
      if (p_Var3 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var3[5]._M_nxt % (this->symbols_by_parent_)._M_h._M_bucket_count] = p_Var6;
        __s = (this->symbols_by_parent_)._M_h._M_buckets;
      }
      __s[(long)__key] = &(this->symbols_by_parent_)._M_h._M_before_begin;
    }
    else {
      p_Var6->_M_nxt = __s[(long)__key]->_M_nxt;
      __s[(long)__key]->_M_nxt = p_Var6;
    }
    psVar2 = &(this->symbols_by_parent_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return local_40 == (__node_ptr)0x0;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               const std::string& name,
                                               Symbol symbol) {
  PointerStringPair by_parent_key(parent, name.c_str());
  return InsertIfNotPresent(&symbols_by_parent_, by_parent_key, symbol);
}